

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

float32 full_norm(vector_t *var,uint32 len)

{
  float64 __x;
  double dVar1;
  double dVar2;
  float32 p;
  float64 det;
  uint32 len_local;
  vector_t *var_local;
  
  __x = determinant((float32 **)var,len);
  if (((double)__x <= 0.0) &&
     (err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
              ,0x167,"Covariance matrix is not positive-definite: determinant is %g\n",__x),
     (double)__x <= 0.0)) {
    __assert_fail("det > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x168,"float32 full_norm(vector_t *, uint32)");
  }
  dVar1 = log(6.283185307179586);
  dVar2 = log((double)__x);
  return (float32)(float)((dVar2 + (double)(float)((double)len * dVar1)) * -0.5);
}

Assistant:

float32
full_norm(vector_t *var,
	  uint32 len)
{
    float64 det;
    float32 p;

    det = determinant(var, len);
    /* Require covariance matrices to be positive-definite. */
    if (det <= 0) {
	E_ERROR("Covariance matrix is not positive-definite: determinant is %g\n",
		det);
	assert(det > 0);
    }
    p = len * log(2.0 * M_PI);

    return - 0.5 * (log(det) + p);
}